

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::ClassName
                   (Descriptor *descriptor,string *out_suffix_added)

{
  Descriptor *in_RSI;
  string *in_RDI;
  string *in_stack_00000010;
  string *in_stack_00000018;
  string *in_stack_00000020;
  string *in_stack_00000028;
  string name;
  string prefix;
  allocator local_89;
  string local_88 [48];
  string local_58 [32];
  string local_38 [16];
  Descriptor *in_stack_ffffffffffffffd8;
  
  Descriptor::file(in_RSI);
  FileClassPrefix_abi_cxx11_((FileDescriptor *)in_RDI);
  ClassNameWorker_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"_Class",&local_89);
  anon_unknown_0::SanitizeNameForObjC
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

string ClassName(const Descriptor* descriptor, string* out_suffix_added) {
  // 1. Message names are used as is (style calls for CamelCase, trust it).
  // 2. Check for reserved word at the very end and then suffix things.
  const string prefix = FileClassPrefix(descriptor->file());
  const string name = ClassNameWorker(descriptor);
  return SanitizeNameForObjC(prefix, name, "_Class", out_suffix_added);
}